

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_box2f(exr_context_t ctxt,exr_attribute_t *a)

{
  undefined8 uVar1;
  exr_result_t eVar2;
  long in_RSI;
  exr_attr_box2f_t tmp;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffec;
  
  uVar1 = **(undefined8 **)(in_RSI + 0x18);
  uVar3 = (undefined4)uVar1;
  uVar4 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar1 = (*(undefined8 **)(in_RSI + 0x18))[1];
  uVar5 = (undefined4)uVar1;
  eVar2 = save_attr_sz((exr_context_t)
                       CONCAT44(in_stack_ffffffffffffffec,(int)((ulong)uVar1 >> 0x20)),
                       CONCAT44(uVar5,uVar4));
  if (eVar2 == 0) {
    eVar2 = save_attr_32((exr_context_t)CONCAT44(uVar5,uVar4),
                         (void *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),0);
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_box2f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t     rv;
    exr_attr_box2f_t tmp = *(a->box2f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_box2f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 4);
    return rv;
}